

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_CheckShortFail_Test::TestBody(TApp_CheckShortFail_Test *this)

{
  input_t *args;
  bool bVar1;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [16];
  
  local_40[0].ptr_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"--two","");
  args = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,local_40,
             &stack0xffffffffffffffe0);
  if (local_40[0].ptr_ != local_30) {
    operator_delete(local_40[0].ptr_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CLI::App::_parse_arg(&(this->super_TApp).app,args,false);
  }
  testing::Message::Message((Message *)local_40);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4eb,
             "Expected: CLI::detail::AppFriend::parse_arg(&app, args, false) throws an exception of type CLI::HorribleError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_40);
  testing::internal::AssertHelper::~AssertHelper(&AStack_48);
  if (((local_40[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_40[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_40[0].ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, CheckShortFail) {
    args = {"--two"};

    EXPECT_THROW(CLI::detail::AppFriend::parse_arg(&app, args, false), CLI::HorribleError);
}